

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::XmlReporter::listTests
          (XmlReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests,
          IConfig *param_2)

{
  TestCaseInfo *this_00;
  ulong __val;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  XmlFormatting fmt;
  uint uVar4;
  pointer pTVar5;
  XmlWriter *this_01;
  string __str;
  ScopedElement innerTag;
  ScopedElement outerTag;
  ScopedElement sourceTag;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  pointer local_88;
  string local_80;
  ScopedElement local_60;
  ScopedElement local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"MatchingTests","");
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_01,(XmlFormatting)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  pTVar5 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_88 = (tests->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar5 != local_88) {
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TestCase","");
      fmt = (XmlFormatting)&local_d0;
      XmlWriter::scopedElement((XmlWriter *)&local_60,(string *)this_01,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      this_00 = pTVar5->m_info;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Name","");
      XmlWriter::startElement(this_01,&local_d0,Indent);
      XmlWriter::writeText(this_01,&this_00->name,None);
      XmlWriter::endElement(this_01,Newline);
      listTests();
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ClassName","");
      XmlWriter::startElement(this_01,&local_d0,Indent);
      XmlWriter::writeText(this_01,&this_00->className,None);
      XmlWriter::endElement(this_01,Newline);
      listTests();
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Tags","");
      XmlWriter::startElement(this_01,&local_d0,Indent);
      TestCaseInfo::tagsAsString_abi_cxx11_(&local_80,this_00);
      XmlWriter::writeText(this_01,&local_80,None);
      XmlWriter::endElement(this_01,Newline);
      listTests();
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"SourceInfo","");
      XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_01,fmt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"File","");
      XmlWriter::startElement(this_01,&local_d0,Indent);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,(this_00->lineInfo).file,&local_a9);
      XmlWriter::writeText(this_01,&local_a8,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Line","");
      XmlWriter::startElement(this_01,&local_d0,Indent);
      __val = (this_00->lineInfo).line;
      uVar4 = 1;
      if (9 < __val) {
        uVar3 = __val;
        uVar2 = 4;
        do {
          uVar4 = uVar2;
          if (uVar3 < 100) {
            uVar4 = uVar4 - 2;
            goto LAB_001630a8;
          }
          if (uVar3 < 1000) {
            uVar4 = uVar4 - 1;
            goto LAB_001630a8;
          }
          if (uVar3 < 10000) goto LAB_001630a8;
          bVar1 = 99999 < uVar3;
          uVar3 = uVar3 / 10000;
          uVar2 = uVar4 + 4;
        } while (bVar1);
        uVar4 = uVar4 + 1;
      }
LAB_001630a8:
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_a8,(ulong)uVar4,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_a8._M_dataplus._M_p,(uint)local_a8._M_string_length,__val);
      XmlWriter::writeText(this_01,&local_a8,None);
      XmlWriter::endElement(this_01,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
      XmlWriter::ScopedElement::~ScopedElement(&local_60);
      pTVar5 = pTVar5 + 1;
    } while (pTVar5 != local_88);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  return;
}

Assistant:

void XmlReporter::listTests(std::vector<TestCaseHandle> const &tests, IConfig const &) {
        auto outerTag = m_xml.scopedElement("MatchingTests");
        for (auto const &test : tests) {
            auto innerTag = m_xml.scopedElement("TestCase");
            auto const &testInfo = test.getTestCaseInfo();
            m_xml.startElement("Name", XmlFormatting::Indent)
                .writeText(testInfo.name, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("ClassName", XmlFormatting::Indent)
                .writeText(testInfo.className, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Tags", XmlFormatting::Indent)
                .writeText(testInfo.tagsAsString(), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);

            auto sourceTag = m_xml.scopedElement("SourceInfo");
            m_xml.startElement("File", XmlFormatting::Indent)
                .writeText(testInfo.lineInfo.file, XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
            m_xml.startElement("Line", XmlFormatting::Indent)
                .writeText(std::to_string(testInfo.lineInfo.line), XmlFormatting::None)
                .endElement(XmlFormatting::Newline);
        }
    }